

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
::iterator::skip_empty(iterator *this)

{
  ctrl_t *pcVar1;
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  *this_00;
  iterator iVar2;
  
  if ((this->it_).ctrl_ != (this->it_end_).ctrl_) {
    return;
  }
  do {
    this_00 = &this->inner_[1].set_;
    this->inner_ = (Inner *)this_00;
    if (this_00 == &this->inner_end_->set_) {
      this->inner_ = (Inner *)0x0;
      return;
    }
    iVar2 = raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
            ::begin(this_00);
    (this->it_).ctrl_ = iVar2.ctrl_;
    (this->it_).field_1 = iVar2.field_1;
    pcVar1 = (this->inner_->set_).ctrl_ + (this->inner_->set_).capacity_;
    (this->it_end_).ctrl_ = pcVar1;
  } while (iVar2.ctrl_ == pcVar1);
  return;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
            return a.ctrl_ == b.ctrl_;
        }